

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualRow.cpp
# Opt level: O0

void __thiscall HDualRow::delete_Freemove(HDualRow *this)

{
  bool bVar1;
  reference piVar2;
  int *piVar3;
  set<int,_std::less<int>,_std::allocator<int>_> *in_RDI;
  int iCol;
  iterator sit;
  _Self in_stack_ffffffffffffffd0;
  int iVar4;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar5;
  _Self local_20;
  _Base_ptr local_18;
  _Rb_tree_const_iterator<int> local_10 [2];
  
  bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1562eb);
  if (!bVar1) {
    std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(local_10);
    local_18 = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::begin(in_RDI);
    local_10[0]._M_node = local_18;
    while( true ) {
      iVar4 = (int)((ulong)in_stack_ffffffffffffffd0._M_node >> 0x20);
      local_20._M_node = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_RDI)
      ;
      bVar1 = std::operator!=(local_10,&local_20);
      if (!bVar1) break;
      piVar2 = std::_Rb_tree_const_iterator<int>::operator*
                         ((_Rb_tree_const_iterator<int> *)0x15634a);
      iVar5 = *piVar2;
      piVar3 = HModel::getNonbasicMove((HModel *)0x15635f);
      piVar3[iVar5] = 0;
      in_stack_ffffffffffffffd0 =
           std::_Rb_tree_const_iterator<int>::operator++
                     ((_Rb_tree_const_iterator<int> *)CONCAT44(iVar5,in_stack_ffffffffffffffd8),
                      iVar4);
    }
  }
  return;
}

Assistant:

void HDualRow::delete_Freemove() {
    if (!freeList.empty()) {
        set<int>::iterator sit;
        for (sit = freeList.begin(); sit != freeList.end(); sit++) {
            int iCol = *sit;
            assert(iCol < workModel->getNumCol());
            workModel->getNonbasicMove()[iCol] = 0;
        }
    }
}